

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allphone_search.c
# Opt level: O0

ps_seg_t * allphone_search_seg_next(ps_seg_t *seg)

{
  phseg_t *phseg;
  phseg_iter_t *itor;
  ps_seg_t *seg_local;
  
  seg[1].vt = (ps_segfuncs_t *)(seg[1].vt)->seg_free;
  if (seg[1].vt == (ps_segfuncs_t *)0x0) {
    allphone_search_seg_free(seg);
    seg_local = (ps_seg_t *)0x0;
  }
  else {
    allphone_search_fill_iter(seg,(phseg_t *)(seg[1].vt)->seg_next);
    seg_local = seg;
  }
  return seg_local;
}

Assistant:

static ps_seg_t *
allphone_search_seg_next(ps_seg_t * seg)
{
    phseg_iter_t *itor = (phseg_iter_t *) seg;
    phseg_t *phseg;

    itor->seg = itor->seg->next;
    
    if (itor->seg == NULL) {
	allphone_search_seg_free(seg);
        return NULL;
    }
    phseg = gnode_ptr(itor->seg);
    allphone_search_fill_iter(seg, phseg);

    return seg;
}